

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O3

bool __thiscall Cache::isPolicyValid(Cache *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char *__format;
  
  uVar1 = (this->policy).cacheSize;
  if (uVar1 - 1 < (uVar1 ^ uVar1 - 1)) {
    uVar2 = (this->policy).blockSize;
    if (uVar2 - 1 < (uVar2 ^ uVar2 - 1)) {
      if (uVar1 % uVar2 == 0) {
        uVar3 = (this->policy).blockNum;
        if (uVar2 * uVar3 == uVar1) {
          if (uVar3 % (this->policy).associativity == 0) {
            return true;
          }
          isPolicyValid();
        }
        else {
          isPolicyValid();
        }
      }
      else {
        isPolicyValid();
      }
      return false;
    }
    __format = "Invalid Block Size %d\n";
    uVar1 = uVar2;
  }
  else {
    __format = "Invalid Cache Size %d\n";
  }
  fprintf(_stderr,__format,(ulong)uVar1);
  return false;
}

Assistant:

bool Cache::isPolicyValid() {
  if (!this->isPowerOfTwo(policy.cacheSize)) {
    fprintf(stderr, "Invalid Cache Size %d\n", policy.cacheSize);
    return false;
  }
  if (!this->isPowerOfTwo(policy.blockSize)) {
    fprintf(stderr, "Invalid Block Size %d\n", policy.blockSize);
    return false;
  }
  if (policy.cacheSize % policy.blockSize != 0) {
    fprintf(stderr, "cacheSize %% blockSize != 0\n");
    return false;
  }
  if (policy.blockNum * policy.blockSize != policy.cacheSize) {
    fprintf(stderr, "blockNum * blockSize != cacheSize\n");
    return false;
  }
  if (policy.blockNum % policy.associativity != 0) {
    fprintf(stderr, "blockNum %% associativity != 0\n");
    return false;
  }
  return true;
}